

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem_dirt.cc
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
FilesystemDirt::ExtractDirtyPath_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,FilesystemDirt *this)

{
  iterator __position;
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  *this_00;
  _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  _Stack_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string path;
  
  this_00 = &_Stack_88;
  if (this->dirty_ == true) {
    if ((this->children_)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      __assert_fail("(!dirty_ || children_.empty()) && \"Dirtying should always remove children\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/filesystem_dirt.cc"
                    ,0x24,
                    "std::experimental::optional<std::string> FilesystemDirt::ExtractDirtyPath()");
    }
    this->dirty_ = false;
    std::__cxx11::string::string((string *)&_Stack_88,"",(allocator *)&path);
  }
  else {
    if ((this->children_)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ).field_0 + 0x10) = 0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->
               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ).field_0 + 0x18) = 0;
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ).field_0._M_payload._M_dataplus._M_p = (pointer)0x0;
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ).field_0._M_payload._M_string_length = 0;
      *(undefined8 *)
       &(__return_storage_ptr__->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        )._M_engaged = 0;
      return __return_storage_ptr__;
    }
    __position._M_node = (this->children_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::operator+(&local_60,"/",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (__position._M_node + 1));
    ExtractDirtyPath_abi_cxx11_
              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&_Stack_88,(FilesystemDirt *)(__position._M_node + 2));
    std::operator+(&path,&local_60,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&_Stack_88);
    std::experimental::fundamentals_v1::
    _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
    ::~_Optional_base(&_Stack_88);
    std::__cxx11::string::~string((string *)&local_60);
    if ((((FilesystemDirt *)(__position._M_node + 2))->dirty_ == false) &&
       (__position._M_node[3]._M_left == (_Base_ptr)0x0)) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,FilesystemDirt>,std::_Select1st<std::pair<std::__cxx11::string_const,FilesystemDirt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
      ::erase_abi_cxx11_((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,FilesystemDirt>,std::_Select1st<std::pair<std::__cxx11::string_const,FilesystemDirt>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,FilesystemDirt>>>
                          *)&this->children_,__position);
    }
    this_00 = (_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               *)&path;
  }
  std::experimental::fundamentals_v1::_Optional_base<std::__cxx11::string,true>::
  _Optional_base<std::__cxx11::string>
            ((_Optional_base<std::__cxx11::string,true> *)__return_storage_ptr__,this_00);
  std::__cxx11::string::~string((string *)this_00);
  return __return_storage_ptr__;
}

Assistant:

std::experimental::optional<std::string> FilesystemDirt::ExtractDirtyPath() {
  assert((!dirty_ || children_.empty()) &&
         "Dirtying should always remove children");
  if (dirty_) {
    // End of search: path is dirty. Return "", so that the pathname
    // components leading up to it can be prepended.
    dirty_ = false;
    return std::string("");
  } else if (!children_.empty()) {
    // Get child that is dirty and prepend the pathname compoment. Reap
    // the child in case its dirty paths are exhausted.
    auto child = children_.begin();
    std::string path("/" + child->first + *child->second.ExtractDirtyPath());
    if (!child->second.dirty_ && child->second.children_.empty())
      children_.erase(child);
    return path;
  } else {
    // There are no dirty paths.
    return {};
  }
}